

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# builder.c
# Opt level: O3

flatcc_builder_ref_t
flatcc_builder_create_buffer
          (flatcc_builder_t *B,char *identifier,uint16_t block_align,flatcc_builder_ref_t object_ref
          ,uint16_t align,flatcc_builder_buffer_flags_t flags)

{
  int iVar1;
  int iVar2;
  uint uVar3;
  ulong uVar4;
  int iVar5;
  int iVar6;
  uint is_nested;
  bool bVar7;
  bool bVar8;
  flatbuffers_uoffset_t buffer_size;
  flatbuffers_uoffset_t object_offset;
  int local_d0;
  int local_cc;
  int local_c8;
  ushort local_c2;
  size_t local_c0;
  uint local_b8;
  flatcc_iovec_t local_b0 [8];
  
  local_d0 = 0;
  is_nested = flags & 1;
  local_c2 = align;
  align_buffer_end(B,&local_c2,block_align,is_nested);
  if (B->min_align < local_c2) {
    B->min_align = local_c2;
  }
  if (identifier == (char *)0x0) {
    uVar3 = 0xfffffffc;
    bVar7 = true;
  }
  else {
    local_d0 = *(int *)identifier;
    bVar7 = local_d0 == 0;
    uVar3 = (uint)bVar7 << 2 | 0xfffffff8;
  }
  iVar1 = B->emit_start;
  bVar8 = (flags & 3) == 0;
  if (bVar8) {
    uVar4 = 0;
  }
  else {
    local_b0[0].iov_base = &local_cc;
    local_b0[0].iov_len = 4;
    uVar4 = 4;
  }
  bVar8 = !bVar8;
  uVar3 = (iVar1 - ((uint)flags * 2 & 4)) + uVar3 & local_c2 - 1;
  local_c0 = uVar4 + 4;
  local_b0[bVar8].iov_base = &local_c8;
  local_b0[bVar8].iov_len = 4;
  local_b8 = bVar8 + 1;
  if (!bVar7) {
    local_c0 = uVar4 | 8;
    *(int **)((long)&local_b0[0].iov_base + (ulong)(local_b8 * 0x10)) = &local_d0;
    *(undefined8 *)((long)&local_b0[0].iov_len + (ulong)(local_b8 * 0x10)) = 4;
    local_b8 = bVar8 | 2;
  }
  if (uVar3 != 0) {
    local_c0 = local_c0 + uVar3;
    *(uint8_t **)((long)&local_b0[0].iov_base + (ulong)(local_b8 << 4)) = "";
    *(ulong *)((long)&local_b0[0].iov_len + (ulong)(local_b8 << 4)) = (ulong)uVar3;
    local_b8 = local_b8 + 1;
  }
  iVar5 = (int)local_c0;
  iVar6 = iVar1 - iVar5;
  local_c8 = iVar6 + (uint)((flags & 3) != 0) * 4;
  local_cc = (&B->emit_end)[is_nested] - local_c8;
  local_c8 = object_ref - local_c8;
  if (iVar5 < 1) {
    __assert_fail("0",
                  "/workspace/llm4binary/github/license_c_cmakelists/dvidelabs[P]flatcc/src/runtime/builder.c"
                  ,0x295,"flatcc_builder_ref_t emit_front(flatcc_builder_t *, flatcc_iov_state_t *)"
                 );
  }
  iVar2 = (*B->emit)(B->emit_context,local_b0,local_b8,iVar6,local_c0);
  if (iVar2 != 0) {
    __assert_fail("0",
                  "/workspace/llm4binary/github/license_c_cmakelists/dvidelabs[P]flatcc/src/runtime/builder.c"
                  ,0x299,"flatcc_builder_ref_t emit_front(flatcc_builder_t *, flatcc_iov_state_t *)"
                 );
  }
  B->emit_start = iVar6;
  if (iVar1 != iVar5) {
    return iVar6;
  }
  __assert_fail("0",
                "/workspace/llm4binary/github/license_c_cmakelists/dvidelabs[P]flatcc/src/runtime/builder.c"
                ,0x313,
                "flatcc_builder_ref_t flatcc_builder_create_buffer(flatcc_builder_t *, const char *, uint16_t, flatcc_builder_ref_t, uint16_t, flatcc_builder_buffer_flags_t)"
               );
}

Assistant:

flatcc_builder_ref_t flatcc_builder_create_buffer(flatcc_builder_t *B,
        const char identifier[identifier_size], uint16_t block_align,
        flatcc_builder_ref_t object_ref, uint16_t align, flatcc_builder_buffer_flags_t flags)
{
    flatcc_builder_ref_t buffer_ref;
    uoffset_t header_pad, id_size = 0;
    uoffset_t object_offset, buffer_size, buffer_base;
    iov_state_t iov;
    flatcc_builder_identifier_t id_out = 0;
    int is_nested = (flags & flatcc_builder_is_nested) != 0;
    int with_size = (flags & flatcc_builder_with_size) != 0;

    if (align_buffer_end(B, &align, block_align, is_nested)) {
        return 0;
    }
    set_min_align(B, align);
    if (identifier) {
        FLATCC_ASSERT(sizeof(flatcc_builder_identifier_t) == identifier_size);
        FLATCC_ASSERT(sizeof(flatcc_builder_identifier_t) == field_size);
        memcpy(&id_out, identifier, identifier_size);
        id_out = __flatbuffers_thash_read_from_le(&id_out);
        write_identifier(&id_out, id_out);
    }
    id_size = id_out ? identifier_size : 0;
    header_pad = front_pad(B, field_size + id_size + (uoffset_t)(with_size ? field_size : 0), align);
    init_iov();
    /* ubyte vectors size field wrapping nested buffer. */
    push_iov_cond(&buffer_size, field_size, is_nested || with_size);
    push_iov(&object_offset, field_size);
    /* Identifiers are not always present in buffer. */
    push_iov(&id_out, id_size);
    push_iov(_pad, header_pad);
    buffer_base = (uoffset_t)B->emit_start - (uoffset_t)iov.len + (uoffset_t)((is_nested || with_size) ? field_size : 0);
    if (is_nested) {
        write_uoffset(&buffer_size, (uoffset_t)B->buffer_mark - buffer_base);
    } else {
        /* Also include clustered vtables. */
        write_uoffset(&buffer_size, (uoffset_t)B->emit_end - buffer_base);
    }
    write_uoffset(&object_offset, (uoffset_t)object_ref - buffer_base);
    if (0 == (buffer_ref = emit_front(B, &iov))) {
        check(0, "emitter rejected buffer content");
        return 0;
    }
    return buffer_ref;
}